

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsExecuter.h
# Opt level: O0

bool __thiscall Refal2::COperationsExecuter::matchLeft_E(COperationsExecuter *this)

{
  bool bVar1;
  CUnitNode **ppCVar2;
  COperationsExecuter *this_local;
  
  bVar1 = shiftLeft(this);
  if (bVar1) {
    bVar1 = CUnit::IsLeftParen(&this->left->super_CUnit);
    if (bVar1) {
      ppCVar2 = CUnit::PairedParen(&this->left->super_CUnit);
      this->left = *ppCVar2;
    }
    saveState(this);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool COperationsExecuter::matchLeft_E()
{
	if( shiftLeft() ) {
		if( left->IsLeftParen() ) {
			left = left->PairedParen();
		}
		saveState();
		return true;
	} else {
		return false;
	}
}